

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrSystemProperties *value
                         )

{
  NextChainResult NVar1;
  size_t sVar2;
  XrResult XVar3;
  allocator local_149;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  string error_message;
  allocator local_101;
  string *local_100;
  string local_f8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string local_98;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  XVar3 = XR_SUCCESS;
  local_100 = command_name;
  if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSystemProperties",value->type,
               "VUID-XrSystemProperties-type-type",XR_TYPE_SYSTEM_PROPERTIES,
               "XR_TYPE_SYSTEM_PROPERTIES");
  }
  if (!check_pnext) goto LAB_0013b5d3;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  error_message._M_dataplus._M_p._0_4_ = 0x3b9fa818;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0a9ec;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9bf2e4;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9fac00;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba38096;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c6fe0;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9f3abf;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9b3f30;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ddf14;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9f2b25;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ddb2c;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba224d4;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c6040;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba082d8;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ca2aa;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9dd742;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9b9520;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9b9138;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9e8708;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c8f22;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9cae60;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ce510;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9ed910;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c96f6;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c96f0;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba155cf;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c9adc;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9d65f9;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0bd70;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0c158;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba384c4;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9c836c;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9f36d0;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0c928;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0c540;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba0b988;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3ba1f5f1;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  error_message._M_dataplus._M_p._0_4_ = 0x3b9e2179;
  std::vector<XrStructureType,_std::allocator<XrStructureType>_>::emplace_back<XrStructureType>
            (&valid_ext_structs,(XrStructureType *)&error_message);
  NVar1 = ValidateNextChain(instance_info,local_100,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_f8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_f8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string
              ((string *)&local_f8,"VUID-XrSystemProperties-next-unique",&local_149);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_98,
               "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct"
               ,&local_101);
    CoreValidLogMessage(instance_info,&local_f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_100,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    std::__cxx11::string::~string((string *)&local_f8);
LAB_0013b5a1:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSystemProperties-next-next",(allocator *)&local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"",
               &local_149);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_100,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_48);
    goto LAB_0013b5a1;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_0013b5d3:
  if (check_members && XVar3 == XR_SUCCESS) {
    sVar2 = strlen(value->systemName);
    XVar3 = XR_SUCCESS;
    if (0x100 < sVar2) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrSystemProperties-systemName-parameter",
                 (allocator *)&local_98);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_78,objects_info);
      std::__cxx11::string::string
                ((string *)&local_f8,
                 "Structure XrSystemProperties member systemName length is too long.",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_100,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_78,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSystemProperties* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SYSTEM_PROPERTIES) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSystemProperties",
                             value->type, "VUID-XrSystemProperties-type-type", XR_TYPE_SYSTEM_PROPERTIES, "XR_TYPE_SYSTEM_PROPERTIES");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ANCHOR_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_BODY_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOCATION_DISCOVERY_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_COLOR_SPACE_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_ENVIRONMENT_DEPTH_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_GAZE_INTERACTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_EYE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACE_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_EXPRESSION_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FACIAL_TRACKING_PROPERTIES_HTC);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FORCE_FEEDBACK_CURL_PROPERTIES_MNDX);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATED_RENDERING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_FOVEATION_EYE_TRACKED_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_MESH_PROPERTIES_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HAND_TRACKING_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_HEADSET_ID_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_KEYBOARD_TRACKING_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_TRACKING_PROPERTIES_VARJO);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_MARKER_UNDERSTANDING_PROPERTIES_ML);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_COLOR_LUT_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES2_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PASSTHROUGH_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_PLANE_DETECTION_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_RENDER_MODEL_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPACE_WARP_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ANCHOR_SHARING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_GROUP_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_PROPERTIES_FB);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_ENTITY_SHARING_PROPERTIES_META);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_MESH_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SCENE_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_SPATIAL_SENSING_PROPERTIES_BD);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_USER_PRESENCE_PROPERTIES_EXT);
        valid_ext_structs.push_back(XR_TYPE_SYSTEM_VIRTUAL_KEYBOARD_PROPERTIES_META);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSystemProperties struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSystemProperties : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSystemProperties struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_SYSTEM_NAME_SIZE < std::strlen(value->systemName)) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-systemName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member systemName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrSystemTrackingProperties is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->trackingProperties);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrSystemProperties-trackingProperties-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSystemProperties member trackingProperties is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}